

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_table.hpp
# Opt level: O0

int Omega_h::get_nrows<Omega_h::Action>(Table<Omega_h::Action> *t)

{
  int iVar1;
  Table<Omega_h::Action> *t_local;
  
  if (t->ncols < 1) {
    fail("assertion %s failed at %s +%d\n","t.ncols > 0",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_table.hpp"
         ,0x18);
  }
  iVar1 = size<Omega_h::Action>(&t->data);
  if (iVar1 % t->ncols == 0) {
    iVar1 = size<Omega_h::Action>(&t->data);
    return iVar1 / t->ncols;
  }
  fail("assertion %s failed at %s +%d\n","size(t.data) % t.ncols == 0",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_table.hpp"
       ,0x19);
}

Assistant:

int get_nrows(Table<T> const& t) {
  OMEGA_H_CHECK(t.ncols > 0);
  OMEGA_H_CHECK(size(t.data) % t.ncols == 0);
  return size(t.data) / t.ncols;
}